

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double orient3dadapt(double *pa,double *pb,double *pc,double *pd,double permanent)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint elen;
  int iVar14;
  int iVar15;
  int flen;
  uint uVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double u [4];
  double w [16];
  double v [12];
  double abt [8];
  double cat [8];
  double bct [8];
  double adet [8];
  double cdet [8];
  double bdet [8];
  double abdet [16];
  double fin1 [192];
  double fin2 [192];
  double dStack_1270;
  double dStack_1240;
  double dStack_1220;
  double dStack_1200;
  double dStack_11d0;
  double dStack_11a0;
  double local_1178;
  double local_1170;
  double local_1168;
  double local_1160;
  double local_1158;
  double dStack_1150;
  double local_1148;
  double dStack_1140;
  double local_1138;
  double dStack_1130;
  double local_1128;
  double dStack_1120;
  double local_1118;
  double dStack_1110;
  double local_1108;
  double dStack_1100;
  double local_10f8;
  double local_10f0;
  undefined1 local_10e8 [16];
  double local_10d8;
  double local_10d0;
  double local_10c8;
  double dStack_10c0;
  double local_10b8;
  double local_10b0;
  undefined1 local_10a8 [16];
  double local_1098;
  double dStack_1090;
  double local_1088;
  double dStack_1080;
  double local_1078;
  double dStack_1070;
  undefined1 local_1068 [16];
  double local_1058;
  double dStack_1050;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  double local_1028;
  double dStack_1020;
  double local_1018;
  undefined8 uStack_1010;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  double local_fe8;
  undefined8 uStack_fe0;
  double local_fd8;
  double dStack_fd0;
  double local_fc8;
  double dStack_fc0;
  double local_fb8;
  double dStack_fb0;
  double local_fa8;
  undefined8 uStack_fa0;
  double local_f98;
  double dStack_f90;
  undefined1 local_f88 [16];
  double local_f78;
  double dStack_f70;
  double local_f68;
  double local_f60;
  double local_f58;
  double dStack_f50;
  double local_f48;
  double local_f40;
  double local_f38;
  double dStack_f30;
  double local_f28;
  double dStack_f20;
  double local_f18 [16];
  double local_e98 [12];
  double local_e38 [8];
  double local_df8 [8];
  double local_db8 [8];
  double local_d78 [8];
  double local_d38 [8];
  double local_cf8 [8];
  double local_cb8 [16];
  double local_c38 [192];
  double local_638 [193];
  
  dVar25 = splitter;
  local_10e8._8_8_ = local_10e8._0_8_;
  local_1038._8_8_ = local_1038._0_8_;
  dVar40 = *pa;
  local_fa8 = pb[1];
  dVar42 = *pb;
  dVar26 = *pc;
  local_fc8 = *pd;
  local_fd8 = pd[1];
  auVar1._8_4_ = SUB84(dVar26,0);
  auVar1._0_8_ = dVar42;
  auVar1._12_4_ = (int)((ulong)dVar26 >> 0x20);
  dVar29 = dVar42 - local_fc8;
  dVar26 = dVar26 - local_fc8;
  uStack_fa0 = 0;
  dVar21 = dVar40 - local_fc8;
  dVar27 = local_fa8 - local_fd8;
  dVar43 = pc[1];
  dVar22 = pa[1];
  auVar2._8_4_ = SUB84(dVar22,0);
  auVar2._0_8_ = dVar43;
  auVar2._12_4_ = (int)((ulong)dVar22 >> 0x20);
  dVar35 = dVar43 - local_fd8;
  auVar3._8_4_ = SUB84(dVar22 - local_fd8,0);
  auVar3._0_8_ = dVar35;
  auVar3._12_4_ = (int)((ulong)(dVar22 - local_fd8) >> 0x20);
  local_1018 = splitter;
  uStack_1010 = 0;
  auVar4._8_4_ = SUB84(splitter,0);
  auVar4._0_8_ = splitter;
  auVar4._12_4_ = (int)((ulong)splitter >> 0x20);
  local_1128 = dVar26 * splitter - (dVar26 * splitter - dVar26);
  dStack_1120 = dVar35 * splitter - (dVar35 * splitter - dVar35);
  dVar31 = dVar27 * splitter - (dVar27 * splitter - dVar27);
  dVar36 = dVar29 * splitter - (dVar29 * splitter - dVar29);
  dVar22 = dVar29 * dVar35;
  local_1008._8_4_ = SUB84(dVar26,0);
  local_1008._0_8_ = dVar35;
  local_1008._12_4_ = (int)((ulong)dVar26 >> 0x20);
  dVar39 = dVar21 * dVar35;
  dVar34 = dVar27 * dVar26;
  local_1118 = dVar26 - local_1128;
  dStack_1110 = dVar35 - dStack_1120;
  local_1088 = dVar27 - dVar31;
  dStack_1080 = dVar29 - dVar36;
  dVar32 = local_1088 * local_1118 -
           (((dVar34 - local_1128 * dVar31) - local_1118 * dVar31) - local_1088 * local_1128);
  dVar37 = dStack_1080 * dStack_1110 -
           (((dVar22 - dVar36 * dStack_1120) - dStack_1080 * dStack_1120) - dStack_1110 * dVar36);
  dVar38 = dVar37 - dVar32;
  dVar28 = dVar22 + dVar38;
  dVar23 = (dVar22 - (dVar28 - (dVar28 - dVar22))) + (dVar38 - (dVar28 - dVar22));
  auVar7._8_4_ = SUB84(dVar34,0);
  auVar7._0_8_ = dVar39;
  auVar7._12_4_ = (int)((ulong)dVar34 >> 0x20);
  dVar24 = dVar23 - dVar34;
  dVar22 = pa[2];
  dVar47 = pb[2];
  local_f38 = (dVar37 - (dVar38 + (dVar37 - dVar38))) + ((dVar37 - dVar38) - dVar32);
  dStack_f30 = (dVar23 - (dVar24 + (dVar23 - dVar24))) + ((dVar23 - dVar24) - dVar34);
  local_fe8 = pd[2];
  dVar34 = pc[2];
  dStack_f20 = dVar28 + dVar24;
  local_f28 = (dVar28 - (dStack_f20 - (dStack_f20 - dVar28))) + (dVar24 - (dStack_f20 - dVar28));
  dVar28 = dVar34 - local_fe8;
  uStack_fe0 = 0;
  local_ff8._8_4_ = SUB84(local_fe8,0);
  local_ff8._0_8_ = local_fe8;
  local_ff8._12_4_ = (int)((ulong)local_fe8 >> 0x20);
  dVar32 = dVar22 - local_fe8;
  dVar41 = dVar47 - local_fe8;
  dVar23 = -local_1128;
  auVar5._8_4_ = SUB84(dVar36,0);
  auVar5._0_8_ = dVar23;
  auVar5._12_4_ = (uint)((ulong)dVar36 >> 0x20) ^ 0x80000000;
  dVar37 = -local_1118;
  dVar44 = -dStack_1080;
  local_1138 = permanent;
  dStack_fd0 = local_fd8;
  dStack_fc0 = local_fc8;
  local_fb8 = local_fc8;
  dStack_fb0 = local_fd8;
  iVar11 = scale_expansion_zeroelim(4,&local_f38,dVar32,local_d78);
  dStack_11d0 = auVar3._8_8_;
  local_1158 = dStack_11d0;
  dStack_1150 = dStack_11d0;
  dVar24 = dVar26 * dStack_11d0;
  dStack_1270 = auVar4._8_8_;
  dVar38 = dVar25 * dStack_11d0 - (dVar25 * dStack_11d0 - dStack_11d0);
  dStack_1090 = dStack_1270 * dVar21 - (dStack_1270 * dVar21 - dVar21);
  local_f98 = dStack_11d0 - dVar38;
  dStack_f90 = dVar21 - dStack_1090;
  local_1098 = -dStack_1090;
  dStack_1090 = -dStack_1090;
  local_1148 = -dStack_f90;
  dStack_1140 = -dStack_f90;
  dVar37 = local_1118 * local_f98 -
           (local_f98 * dVar23 + dVar38 * dVar37 + dVar24 + dVar38 * dVar23);
  dVar30 = dStack_1110 * dStack_f90 -
           (local_1098 * dStack_1110 + local_1148 * dStack_1120 + dVar39 + local_1098 * dStack_1120)
  ;
  dVar33 = dVar37 - dVar30;
  dVar25 = dVar24 + dVar33;
  dVar23 = (dVar24 - (dVar25 - (dVar25 - dVar24))) + (dVar33 - (dVar25 - dVar24));
  dVar24 = dVar23 - dVar39;
  local_f58 = (dVar37 - (dVar33 + (dVar37 - dVar33))) + ((dVar37 - dVar33) - dVar30);
  dStack_f50 = (dVar23 - ((dVar23 - dVar24) + dVar24)) + ((dVar23 - dVar24) - dVar39);
  local_f40 = dVar25 + dVar24;
  local_f48 = (dVar25 - (local_f40 - (local_f40 - dVar25))) + (dVar24 - (local_f40 - dVar25));
  local_f88._8_4_ = SUB84(local_f98,0);
  local_f88._0_8_ = dStack_f90;
  local_f88._12_4_ = (int)((ulong)local_f98 >> 0x20);
  local_10a8._8_4_ = SUB84(dVar41,0);
  local_10a8._0_8_ = dVar41;
  local_10a8._12_4_ = (int)((ulong)dVar41 >> 0x20);
  iVar12 = scale_expansion_zeroelim(4,&local_f58,dVar41,local_cf8);
  dVar24 = dVar27 * dVar21;
  dVar37 = dStack_11d0 * dVar29;
  dStack_1240 = auVar5._8_8_;
  dVar30 = (double)local_f88._0_8_ * local_1088 -
           (local_1088 * local_1098 + local_1148 * dVar31 + local_1098 * dVar31 + dVar24);
  dVar33 = (double)local_f88._8_8_ * dStack_1080 -
           (local_f98 * dStack_1240 + dVar44 * dVar38 + dStack_1240 * dVar38 + dVar37);
  dVar38 = dVar30 - dVar33;
  dVar23 = dVar24 + dVar38;
  dVar24 = (dVar24 - (dVar23 - (dVar23 - dVar24))) + (dVar38 - (dVar23 - dVar24));
  dVar25 = dVar24 - dVar37;
  local_f78 = (dVar30 - (dVar38 + (dVar30 - dVar38))) + ((dVar30 - dVar38) - dVar33);
  dStack_f70 = (dVar24 - ((dVar24 - dVar25) + dVar25)) + ((dVar24 - dVar25) - dVar37);
  local_f60 = dVar23 + dVar25;
  local_f68 = (dVar23 - (local_f60 - (local_f60 - dVar23))) + (dVar25 - (local_f60 - dVar23));
  pdVar17 = local_d38;
  iVar13 = scale_expansion_zeroelim(4,&local_f78,dVar28,pdVar17);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,local_d78,iVar12,local_cf8,local_cb8);
  pdVar18 = local_c38;
  elen = fast_expansion_sum_zeroelim(iVar11,local_cb8,iVar13,pdVar17,pdVar18);
  if (1 < (int)elen) {
    pdVar17 = (double *)0x1;
    do {
      local_c38[0] = local_c38[0] + local_c38[(long)pdVar17];
      pdVar17 = (double *)((long)pdVar17 + 1);
    } while ((double *)(ulong)elen != pdVar17);
  }
  dStack_1220 = auVar1._8_8_;
  dStack_1200 = auVar2._8_8_;
  if (o3derrboundB * local_1138 <= local_c38[0]) {
    return local_c38[0];
  }
  if (o3derrboundB * local_1138 <= -local_c38[0]) {
    return local_c38[0];
  }
  dVar40 = (dVar40 - (dVar21 + (dVar40 - dVar21))) + ((dVar40 - dVar21) - local_fb8);
  dVar23 = (dVar42 - (dVar29 + (dVar42 - dVar29))) + ((dVar42 - dVar29) - local_fc8);
  dVar24 = (dStack_1220 - (dVar26 + (dStack_1220 - dVar26))) + ((dStack_1220 - dVar26) - dStack_fc0)
  ;
  dVar25 = (dVar43 - (dVar35 + (dVar43 - dVar35))) + ((dVar43 - dVar35) - local_fd8);
  dVar38 = (dStack_1200 - (dStack_11d0 + (dStack_1200 - dStack_11d0))) +
           ((dStack_1200 - dStack_11d0) - dStack_fd0);
  dVar42 = (dVar22 - (dVar32 + (dVar22 - dVar32))) + ((dVar22 - dVar32) - (double)local_ff8._0_8_);
  dVar43 = (dVar47 - (dVar41 + (dVar47 - dVar41))) + ((dVar47 - dVar41) - (double)local_ff8._8_8_);
  dVar22 = (dVar34 - (dVar28 + (dVar34 - dVar28))) + ((dVar34 - dVar28) - local_fe8);
  dVar47 = (local_fa8 - (dVar27 + (local_fa8 - dVar27))) + ((local_fa8 - dVar27) - dStack_fb0);
  auVar6._8_4_ = (int)-(ulong)(dVar47 == 0.0);
  auVar6._0_8_ = -(ulong)(dVar22 == 0.0);
  auVar6._12_4_ = (int)(-(ulong)(dVar47 == 0.0) >> 0x20);
  uVar16 = movmskpd((int)pdVar17,auVar6);
  bVar10 = (byte)uVar16 >> 1;
  if (((((dVar40 == 0.0) && (!NAN(dVar40))) && (dVar23 == 0.0)) &&
      ((!NAN(dVar23) && (dVar24 == 0.0)))) &&
     ((((!NAN(dVar24) && ((dVar38 == 0.0 && (!NAN(dVar38))))) && (bVar10 != 0)) &&
      ((((dVar25 == 0.0 && (!NAN(dVar25))) && (dVar42 == 0.0)) &&
       (((!NAN(dVar42) && (dVar43 == 0.0)) && ((!NAN(dVar43) && ((uVar16 & 1) != 0)))))))))) {
    return local_c38[0];
  }
  dVar45 = local_1138 * o3derrboundC + ABS(local_c38[0]) * resulterrbound;
  dVar34 = dVar23 * dVar35;
  dVar30 = dVar24 * dStack_11d0;
  local_1138 = dVar47 * dVar26;
  dStack_1130 = dVar25 * dVar21;
  dStack_11a0 = auVar7._8_8_;
  dVar33 = dVar40 * dVar27;
  dVar44 = dVar29 * dVar38;
  local_c38[0] = ((dVar21 * dVar47 + dVar33) - (local_1158 * dVar23 + dVar44)) * dVar28 +
                 (dVar21 * dVar27 - dVar37) * dVar22 +
                 ((dVar26 * dVar38 + dVar30) - (dVar40 * dVar35 + dStack_1130)) * dVar41 +
                 (dStack_11d0 * (double)local_1008._8_8_ - dVar39) * dVar43 +
                 ((dVar29 * dVar25 + dVar34) - (dVar24 * dVar27 + local_1138)) * dVar32 +
                 (dVar29 * (double)local_1008._0_8_ - dStack_11a0) * dVar42 + local_c38[0];
  if (dVar45 <= local_c38[0]) {
    return local_c38[0];
  }
  if (dVar45 <= -local_c38[0]) {
    return local_c38[0];
  }
  if ((dVar40 != 0.0) || (NAN(dVar40))) {
    dVar39 = dVar40 * local_1018 - (dVar40 * local_1018 - dVar40);
    local_1098 = dVar40 - dVar39;
    dStack_1090 = 0.0;
    local_10c8 = local_1098 * local_1088 -
                 (((dVar33 - dVar39 * dVar31) - local_1098 * dVar31) - dVar39 * local_1088);
    local_1148 = dVar27;
    dStack_1140 = dVar27;
    if ((dVar38 != 0.0) || (NAN(dVar38))) {
      dVar41 = local_1018 * dVar38 - (local_1018 * dVar38 - dVar38);
      dVar37 = dVar38 - dVar41;
      dVar31 = dStack_1080 * dVar37 -
               (((dVar44 - dVar41 * dVar36) - dVar36 * dVar37) - dVar41 * dStack_1080);
      dVar46 = local_10c8 - dVar31;
      dVar45 = dVar33 + dVar46;
      dVar33 = (dVar33 - (dVar45 - (dVar45 - dVar33))) + (dVar46 - (dVar45 - dVar33));
      dVar36 = dVar33 - dVar44;
      local_10c8 = (local_10c8 - (dVar46 + (local_10c8 - dVar46))) +
                   ((local_10c8 - dVar46) - dVar31);
      dStack_10c0 = (dVar33 - ((dVar33 - dVar36) + dVar36)) + ((dVar33 - dVar36) - dVar44);
      local_10b0 = dVar45 + dVar36;
      local_10b8 = (dVar45 - (local_10b0 - (local_10b0 - dVar45))) +
                   (dVar36 - (local_10b0 - dVar45));
      dVar31 = dVar38 * dVar26;
      dVar36 = dVar35 * dVar40;
      dVar37 = dVar37 * local_1118 -
               (-dVar41 * local_1118 + -dVar37 * local_1128 + -dVar41 * local_1128 + dVar31);
      dVar39 = local_1098 * dStack_1110 -
               (-dVar39 * dStack_1110 + -local_1098 * dStack_1120 + -dVar39 * dStack_1120 + dVar36);
      dVar44 = dVar37 - dVar39;
      dVar33 = dVar31 + dVar44;
      dVar31 = (dVar31 - (dVar33 - (dVar33 - dVar31))) + (dVar44 - (dVar33 - dVar31));
      dVar41 = dVar31 - dVar36;
      dVar31 = (dVar31 - (dVar41 + (dVar31 - dVar41))) + ((dVar31 - dVar41) - dVar36);
      local_1038._8_4_ = SUB84(dVar31,0);
      local_1038._0_8_ = (dVar37 - (dVar44 + (dVar37 - dVar44))) + ((dVar37 - dVar44) - dVar39);
      local_1038._12_4_ = (int)((ulong)dVar31 >> 0x20);
      dStack_1020 = dVar33 + dVar41;
      local_1028 = (dVar33 - (dStack_1020 - (dStack_1020 - dVar33))) +
                   (dVar41 - (dStack_1020 - dVar33));
      iVar11 = 4;
    }
    else {
      dVar39 = -dVar40;
      dVar37 = local_1018 * dVar39 - (dVar40 + local_1018 * dVar39);
      local_1038._8_8_ = dVar35 * dVar39;
      local_1038._0_8_ =
           dStack_1110 * (dVar39 - dVar37) -
           (((dVar35 * dVar39 - dVar37 * dStack_1120) - dStack_1120 * (dVar39 - dVar37)) -
           dVar37 * dStack_1110);
      iVar11 = 2;
      dStack_10c0 = dVar33;
    }
  }
  else if ((dVar38 != 0.0) || (NAN(dVar38))) {
    dVar39 = -dVar38;
    dStack_10c0 = dVar29 * dVar39;
    dVar37 = local_1018 * dVar39 - (dVar38 + local_1018 * dVar39);
    local_10c8 = dStack_1080 * (dVar39 - dVar37) -
                 (((dStack_10c0 - dVar37 * dVar36) - dVar36 * (dVar39 - dVar37)) -
                 dVar37 * dStack_1080);
    dVar39 = local_1018 * dVar38 - (local_1018 * dVar38 - dVar38);
    local_1038._8_8_ = dVar26 * dVar38;
    local_1038._0_8_ =
         (dVar38 - dVar39) * local_1118 -
         (((dVar26 * dVar38 - dVar39 * local_1128) - local_1128 * (dVar38 - dVar39)) -
         dVar39 * local_1118);
    iVar11 = 2;
  }
  else {
    local_10c8 = 0.0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_1038._8_8_;
    local_1038 = auVar8 << 0x40;
    iVar11 = 1;
  }
  if ((dVar23 != 0.0) || (NAN(dVar23))) {
    dVar31 = dVar23 * splitter - (dVar23 * splitter - dVar23);
    dVar39 = dVar23 - dVar31;
    dVar37 = dVar35 * splitter - (dVar35 * splitter - dVar35);
    local_10e8._0_8_ =
         (dVar35 - dVar37) * dVar39 -
         (((dVar34 - dVar31 * dVar37) - dVar37 * dVar39) - dVar31 * (dVar35 - dVar37));
    if (bVar10 != 0) {
      local_10e8._8_8_ = dVar34;
      dVar34 = -dVar23;
      dStack_1050 = local_1158 * dVar34;
      dVar26 = splitter * dVar34 - (dVar23 + splitter * dVar34);
      dVar35 = local_1158 * splitter - (local_1158 * splitter - local_1158);
      dVar39 = ((dStack_1050 - dVar26 * dVar35) - dVar35 * (dVar34 - dVar26)) -
               dVar26 * (local_1158 - dVar35);
      local_1058 = (local_1158 - dVar35) * (dVar34 - dVar26);
      goto LAB_0015efc2;
    }
    dVar36 = dVar47 * splitter - (dVar47 * splitter - dVar47);
    dVar33 = dVar47 - dVar36;
    dVar35 = dVar26 * splitter - (dVar26 * splitter - dVar26);
    dVar41 = (dVar26 - dVar35) * dVar33 -
             (((local_1138 - dVar36 * dVar35) - dVar35 * dVar33) - dVar36 * (dVar26 - dVar35));
    dVar37 = (double)local_10e8._0_8_ - dVar41;
    dVar35 = dVar34 + dVar37;
    dVar26 = (dVar34 - (dVar35 - (dVar35 - dVar34))) + (dVar37 - (dVar35 - dVar34));
    dVar34 = dVar26 - local_1138;
    dVar26 = (dVar26 - ((dVar26 - dVar34) + dVar34)) + ((dVar26 - dVar34) - local_1138);
    local_10e8._8_4_ = SUB84(dVar26,0);
    local_10e8._0_8_ =
         ((double)local_10e8._0_8_ - (dVar37 + ((double)local_10e8._0_8_ - dVar37))) +
         (((double)local_10e8._0_8_ - dVar37) - dVar41);
    local_10e8._12_4_ = (int)((ulong)dVar26 >> 0x20);
    local_10d0 = dVar35 + dVar34;
    local_10d8 = (dVar35 - (local_10d0 - (local_10d0 - dVar35))) + (dVar34 - (local_10d0 - dVar35));
    dVar26 = splitter * dVar21 - (splitter * dVar21 - dVar21);
    dVar34 = splitter * dStack_11d0 - (splitter * dStack_11d0 - dStack_11d0);
    dVar35 = dVar47 * dVar21;
    dVar37 = dVar23 * dStack_11d0;
    dVar33 = dVar33 * (dVar21 - dVar26) -
             (-dVar36 * (dVar21 - dVar26) + -dVar33 * dVar26 + -dVar36 * dVar26 + dVar35);
    dVar39 = dVar39 * (dStack_11d0 - dVar34) -
             (-dVar31 * (dStack_11d0 - dVar34) + -dVar39 * dVar34 + -dVar31 * dVar34 + dVar37);
    dVar31 = dVar33 - dVar39;
    dVar26 = dVar35 + dVar31;
    dVar34 = (dVar35 - (dVar26 - (dVar26 - dVar35))) + (dVar31 - (dVar26 - dVar35));
    dVar35 = dVar34 - dVar37;
    local_1058 = (dVar33 - (dVar31 + (dVar33 - dVar31))) + ((dVar33 - dVar31) - dVar39);
    dStack_1050 = (dVar34 - (dVar35 + (dVar34 - dVar35))) + ((dVar34 - dVar35) - dVar37);
    dVar34 = dVar26 + dVar35;
    local_1048._8_4_ = SUB84(dVar34,0);
    local_1048._0_8_ = (dVar26 - (dVar34 - (dVar34 - dVar26))) + (dVar35 - (dVar34 - dVar26));
    local_1048._12_4_ = (int)((ulong)dVar34 >> 0x20);
    iVar12 = 4;
  }
  else if (bVar10 == 0) {
    dVar34 = -dVar47;
    dVar35 = splitter * dVar34 - (dVar47 + splitter * dVar34);
    dVar39 = dVar26 * splitter - (dVar26 * splitter - dVar26);
    local_10e8._8_8_ = dVar26 * dVar34;
    local_10e8._0_8_ =
         (dVar26 - dVar39) * (dVar34 - dVar35) -
         (((dVar26 * dVar34 - dVar35 * dVar39) - dVar39 * (dVar34 - dVar35)) -
         dVar35 * (dVar26 - dVar39));
    dStack_1050 = dVar21 * dVar47;
    dVar34 = dVar47 * splitter - (dVar47 * splitter - dVar47);
    dVar26 = splitter * dVar21 - (splitter * dVar21 - dVar21);
    dVar39 = ((dStack_1050 - dVar34 * dVar26) - dVar26 * (dVar47 - dVar34)) -
             dVar34 * (dVar21 - dVar26);
    local_1058 = (dVar21 - dVar26) * (dVar47 - dVar34);
LAB_0015efc2:
    local_1058 = local_1058 - dVar39;
    iVar12 = 2;
  }
  else {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_10e8._8_8_;
    local_10e8 = auVar9 << 0x40;
    local_1058 = 0.0;
    iVar12 = 1;
  }
  if ((dVar24 != 0.0) || (NAN(dVar24))) {
    dVar34 = dVar24 * splitter - (dVar24 * splitter - dVar24);
    dVar26 = dVar24 - dVar34;
    dVar35 = local_1158 * splitter - (local_1158 * splitter - local_1158);
    local_1108 = (local_1158 - dVar35) * dVar26 -
                 (((dVar30 - dVar34 * dVar35) - dVar35 * dVar26) - dVar34 * (local_1158 - dVar35));
    if ((dVar25 == 0.0) && (!NAN(dVar25))) {
      dVar34 = -dVar24;
      dStack_1070 = dVar27 * dVar34;
      dVar26 = splitter * dVar34 - (dVar24 + splitter * dVar34);
      dVar29 = dVar27 * splitter - (dVar27 * splitter - dVar27);
      local_1078 = (dVar27 - dVar29) * (dVar34 - dVar26) -
                   (((dStack_1070 - dVar26 * dVar29) - dVar29 * (dVar34 - dVar26)) -
                   dVar26 * (dVar27 - dVar29));
      dStack_1100 = dVar30;
      goto LAB_0015f505;
    }
    dVar37 = dVar25 * splitter - (dVar25 * splitter - dVar25);
    dVar31 = dVar25 - dVar37;
    dVar35 = dVar21 * splitter - (dVar21 * splitter - dVar21);
    dVar33 = (dVar21 - dVar35) * dVar31 -
             (((dStack_1130 - dVar37 * dVar35) - dVar35 * dVar31) - dVar37 * (dVar21 - dVar35));
    dVar36 = local_1108 - dVar33;
    dVar35 = dVar30 + dVar36;
    dVar39 = (dVar30 - (dVar35 - (dVar35 - dVar30))) + (dVar36 - (dVar35 - dVar30));
    dVar21 = dVar39 - dStack_1130;
    local_1108 = (local_1108 - (dVar36 + (local_1108 - dVar36))) + ((local_1108 - dVar36) - dVar33);
    dStack_1100 = (dVar39 - ((dVar39 - dVar21) + dVar21)) + ((dVar39 - dVar21) - dStack_1130);
    local_10f0 = dVar35 + dVar21;
    local_10f8 = (dVar35 - (local_10f0 - (local_10f0 - dVar35))) + (dVar21 - (local_10f0 - dVar35));
    dVar35 = splitter * dVar29 - (splitter * dVar29 - dVar29);
    dVar39 = splitter * dVar27 - (splitter * dVar27 - dVar27);
    dVar21 = dVar25 * dVar29;
    dVar30 = dVar24 * dVar27;
    dVar35 = dVar31 * (dVar29 - dVar35) -
             (-dVar37 * (dVar29 - dVar35) + -dVar31 * dVar35 + -dVar37 * dVar35 + dVar21);
    dVar39 = dVar26 * (dVar27 - dVar39) -
             (-dVar34 * (dVar27 - dVar39) + -dVar26 * dVar39 + -dVar34 * dVar39 + dVar30);
    dVar27 = dVar35 - dVar39;
    dVar26 = dVar21 + dVar27;
    dVar34 = (dVar21 - (dVar26 - (dVar26 - dVar21))) + (dVar27 - (dVar26 - dVar21));
    dVar29 = dVar34 - dVar30;
    local_1078 = (dVar35 - (dVar27 + (dVar35 - dVar27))) + ((dVar35 - dVar27) - dVar39);
    dStack_1070 = (dVar34 - (dVar29 + (dVar34 - dVar29))) + ((dVar34 - dVar29) - dVar30);
    dVar34 = dVar26 + dVar29;
    local_1068._8_4_ = SUB84(dVar34,0);
    local_1068._0_8_ = (dVar26 - (dVar34 - (dVar34 - dVar26))) + (dVar29 - (dVar34 - dVar26));
    local_1068._12_4_ = (int)((ulong)dVar34 >> 0x20);
    iVar13 = 4;
  }
  else if ((dVar25 != 0.0) || (NAN(dVar25))) {
    dVar34 = -dVar25;
    dVar26 = splitter * dVar34 - (dVar25 + splitter * dVar34);
    dVar35 = dVar21 * splitter - (dVar21 * splitter - dVar21);
    local_1108 = (dVar21 - dVar35) * (dVar34 - dVar26) -
                 (((dVar21 * dVar34 - dVar26 * dVar35) - dVar35 * (dVar34 - dVar26)) -
                 dVar26 * (dVar21 - dVar35));
    dStack_1070 = dVar29 * dVar25;
    dVar35 = dVar25 * splitter - (dVar25 * splitter - dVar25);
    dVar26 = splitter * dVar29 - (splitter * dVar29 - dVar29);
    local_1078 = (dVar29 - dVar26) * (dVar25 - dVar35) -
                 (((dStack_1070 - dVar35 * dVar26) - dVar26 * (dVar25 - dVar35)) -
                 dVar35 * (dVar29 - dVar26));
    dStack_1100 = dVar21 * dVar34;
LAB_0015f505:
    iVar13 = 2;
  }
  else {
    local_1108 = 0.0;
    local_1078 = 0.0;
    iVar13 = 1;
  }
  iVar14 = fast_expansion_sum_zeroelim(iVar12,(double *)local_10e8,iVar13,&local_1078,local_db8);
  iVar15 = scale_expansion_zeroelim(iVar14,local_db8,dVar32,local_f18);
  pdVar17 = local_638;
  iVar15 = fast_expansion_sum_zeroelim(elen,pdVar18,iVar15,local_f18,pdVar17);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,&local_1108,iVar11,(double *)local_1038,local_df8);
  flen = scale_expansion_zeroelim(iVar13,local_df8,(double)local_10a8._0_8_,local_f18);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,pdVar17,flen,local_f18,pdVar18);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,&local_10c8,iVar12,&local_1058,local_e38);
  iVar12 = scale_expansion_zeroelim(iVar11,local_e38,dVar28,local_f18);
  iVar12 = fast_expansion_sum_zeroelim(iVar15,pdVar18,iVar12,local_f18,pdVar17);
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    iVar15 = scale_expansion_zeroelim(4,&local_f38,dVar42,local_e98);
    pdVar18 = local_638;
    pdVar17 = local_c38;
    iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar18,iVar15,local_e98,pdVar17);
  }
  if ((dVar43 != 0.0) || (pdVar19 = pdVar17, NAN(dVar43))) {
    iVar15 = scale_expansion_zeroelim(4,&local_f58,dVar43,local_e98);
    iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar17,iVar15,local_e98,pdVar18);
    pdVar19 = pdVar18;
    pdVar18 = pdVar17;
  }
  if ((dVar22 != 0.0) || (pdVar17 = pdVar19, NAN(dVar22))) {
    iVar15 = scale_expansion_zeroelim(4,&local_f78,dVar22,local_e98);
    iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar19,iVar15,local_e98,pdVar18);
    pdVar17 = pdVar18;
    pdVar18 = pdVar19;
  }
  if ((dVar40 != 0.0) || (NAN(dVar40))) {
    if ((dVar47 != 0.0) || (pdVar19 = pdVar18, pdVar20 = pdVar17, NAN(dVar47))) {
      dVar27 = dVar40 * dVar47;
      dVar26 = dVar40 * splitter - (dVar40 * splitter - dVar40);
      dVar34 = dVar47 * splitter - (dVar47 * splitter - dVar47);
      dVar21 = (dVar47 - dVar34) * (dVar40 - dVar26) -
               (((dVar27 - dVar26 * dVar34) - dVar34 * (dVar40 - dVar26)) -
               dVar26 * (dVar47 - dVar34));
      dVar29 = dVar28 * splitter - (dVar28 * splitter - dVar28);
      dVar35 = dVar28 - dVar29;
      dVar34 = dVar28 * dVar21;
      dVar26 = splitter * dVar21 - (splitter * dVar21 - dVar21);
      local_1178 = (dVar21 - dVar26) * dVar35 -
                   (((dVar34 - dVar26 * dVar29) - (dVar21 - dVar26) * dVar29) - dVar26 * dVar35);
      dVar39 = dVar27 * dVar28;
      dVar26 = splitter * dVar27 - (splitter * dVar27 - dVar27);
      dVar26 = (dVar27 - dVar26) * dVar35 -
               (((dVar39 - dVar26 * dVar29) - dVar29 * (dVar27 - dVar26)) - dVar26 * dVar35);
      local_1168 = dVar26 + dVar34;
      local_1170 = (dVar34 - (local_1168 - (local_1168 - dVar34))) +
                   (dVar26 - (local_1168 - dVar34));
      local_1160 = dVar39 + local_1168;
      local_1168 = local_1168 - (local_1160 - dVar39);
      iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar17,4,&local_1178,pdVar18);
      if ((dVar22 != 0.0) || (pdVar19 = pdVar17, pdVar20 = pdVar18, NAN(dVar22))) {
        dVar29 = dVar22 * splitter - (dVar22 * splitter - dVar22);
        dVar35 = dVar22 - dVar29;
        dVar26 = dVar22 * dVar21;
        dVar34 = dVar21 * splitter - (dVar21 * splitter - dVar21);
        local_1178 = (dVar21 - dVar34) * dVar35 -
                     (((dVar26 - dVar34 * dVar29) - (dVar21 - dVar34) * dVar29) - dVar34 * dVar35);
        dVar39 = dVar27 * dVar22;
        dVar34 = splitter * dVar27 - (splitter * dVar27 - dVar27);
        dVar34 = (dVar27 - dVar34) * dVar35 -
                 (((dVar39 - dVar34 * dVar29) - dVar29 * (dVar27 - dVar34)) - dVar34 * dVar35);
        local_1168 = dVar26 + dVar34;
        local_1170 = (dVar26 - (local_1168 - (local_1168 - dVar26))) +
                     (dVar34 - (local_1168 - dVar26));
        local_1160 = dVar39 + local_1168;
        local_1168 = local_1168 - (local_1160 - dVar39);
        iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar18,4,&local_1178,pdVar17);
        pdVar19 = pdVar18;
        pdVar20 = pdVar17;
      }
    }
    if ((dVar25 != 0.0) || (pdVar17 = pdVar20, pdVar18 = pdVar19, NAN(dVar25))) {
      dVar26 = -dVar40;
      dVar39 = dVar25 * dVar26;
      dVar40 = splitter * dVar26 - (dVar40 + splitter * dVar26);
      dVar34 = dVar25 * splitter - (dVar25 * splitter - dVar25);
      dVar21 = (dVar25 - dVar34) * (dVar26 - dVar40) -
               (((dVar39 - dVar40 * dVar34) - dVar34 * (dVar26 - dVar40)) -
               dVar40 * (dVar25 - dVar34));
      dVar34 = (double)local_10a8._0_8_ * splitter -
               ((double)local_10a8._0_8_ * splitter - (double)local_10a8._0_8_);
      dVar29 = (double)local_10a8._0_8_ - dVar34;
      dVar26 = (double)local_10a8._0_8_ * dVar21;
      dVar40 = splitter * dVar21 - (splitter * dVar21 - dVar21);
      local_1178 = (dVar21 - dVar40) * dVar29 -
                   (((dVar26 - dVar40 * dVar34) - (dVar21 - dVar40) * dVar34) - dVar40 * dVar29);
      dVar35 = (double)local_10a8._0_8_ * dVar39;
      dVar40 = splitter * dVar39 - (splitter * dVar39 - dVar39);
      dVar40 = (dVar39 - dVar40) * dVar29 -
               (((dVar35 - dVar40 * dVar34) - dVar34 * (dVar39 - dVar40)) - dVar40 * dVar29);
      local_1168 = dVar40 + dVar26;
      local_1170 = (dVar26 - (local_1168 - (local_1168 - dVar26))) +
                   (dVar40 - (local_1168 - dVar26));
      local_1160 = dVar35 + local_1168;
      local_1168 = local_1168 - (local_1160 - dVar35);
      iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar20,4,&local_1178,pdVar19);
      if ((dVar43 != 0.0) || (pdVar17 = pdVar19, pdVar18 = pdVar20, NAN(dVar43))) {
        dVar34 = dVar43 * splitter - (dVar43 * splitter - dVar43);
        dVar29 = dVar43 - dVar34;
        dVar40 = dVar43 * dVar21;
        dVar26 = dVar21 * splitter - (dVar21 * splitter - dVar21);
        local_1178 = (dVar21 - dVar26) * dVar29 -
                     (((dVar40 - dVar26 * dVar34) - (dVar21 - dVar26) * dVar34) - dVar26 * dVar29);
        dVar35 = dVar39 * dVar43;
        dVar26 = splitter * dVar39 - (splitter * dVar39 - dVar39);
        dVar26 = (dVar39 - dVar26) * dVar29 -
                 (((dVar35 - dVar26 * dVar34) - dVar34 * (dVar39 - dVar26)) - dVar26 * dVar29);
        local_1168 = dVar40 + dVar26;
        local_1170 = (dVar40 - (local_1168 - (local_1168 - dVar40))) +
                     (dVar26 - (local_1168 - dVar40));
        local_1160 = dVar35 + local_1168;
        local_1168 = local_1168 - (local_1160 - dVar35);
        iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar19,4,&local_1178,pdVar20);
        pdVar17 = pdVar20;
        pdVar18 = pdVar19;
      }
    }
  }
  if ((dVar23 != 0.0) || (NAN(dVar23))) {
    if ((dVar25 != 0.0) || (pdVar19 = pdVar18, pdVar20 = pdVar17, NAN(dVar25))) {
      dVar21 = dVar23 * dVar25;
      dVar40 = dVar23 * splitter - (dVar23 * splitter - dVar23);
      dVar26 = dVar25 * splitter - (dVar25 * splitter - dVar25);
      dVar39 = (dVar25 - dVar26) * (dVar23 - dVar40) -
               (((dVar21 - dVar40 * dVar26) - dVar26 * (dVar23 - dVar40)) -
               dVar40 * (dVar25 - dVar26));
      dVar34 = dVar32 * splitter - (dVar32 * splitter - dVar32);
      dVar29 = dVar32 - dVar34;
      dVar26 = dVar32 * dVar39;
      dVar40 = splitter * dVar39 - (splitter * dVar39 - dVar39);
      local_1178 = (dVar39 - dVar40) * dVar29 -
                   (((dVar26 - dVar40 * dVar34) - (dVar39 - dVar40) * dVar34) - dVar40 * dVar29);
      dVar35 = dVar32 * dVar21;
      dVar40 = splitter * dVar21 - (splitter * dVar21 - dVar21);
      dVar40 = (dVar21 - dVar40) * dVar29 -
               (((dVar35 - dVar40 * dVar34) - dVar34 * (dVar21 - dVar40)) - dVar40 * dVar29);
      local_1168 = dVar40 + dVar26;
      local_1170 = (dVar26 - (local_1168 - (local_1168 - dVar26))) +
                   (dVar40 - (local_1168 - dVar26));
      local_1160 = dVar35 + local_1168;
      local_1168 = local_1168 - (local_1160 - dVar35);
      iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar17,4,&local_1178,pdVar18);
      if ((dVar42 != 0.0) || (pdVar19 = pdVar17, pdVar20 = pdVar18, NAN(dVar42))) {
        dVar34 = dVar42 * splitter - (dVar42 * splitter - dVar42);
        dVar29 = dVar42 - dVar34;
        dVar40 = dVar42 * dVar39;
        dVar26 = dVar39 * splitter - (dVar39 * splitter - dVar39);
        local_1178 = (dVar39 - dVar26) * dVar29 -
                     (((dVar40 - dVar26 * dVar34) - (dVar39 - dVar26) * dVar34) - dVar26 * dVar29);
        dVar35 = dVar42 * dVar21;
        dVar26 = splitter * dVar21 - (splitter * dVar21 - dVar21);
        dVar26 = (dVar21 - dVar26) * dVar29 -
                 (((dVar35 - dVar26 * dVar34) - dVar34 * (dVar21 - dVar26)) - dVar26 * dVar29);
        local_1168 = dVar40 + dVar26;
        local_1170 = (dVar40 - (local_1168 - (local_1168 - dVar40))) +
                     (dVar26 - (local_1168 - dVar40));
        local_1160 = dVar35 + local_1168;
        local_1168 = local_1168 - (local_1160 - dVar35);
        iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar18,4,&local_1178,pdVar17);
        pdVar19 = pdVar18;
        pdVar20 = pdVar17;
      }
    }
    if ((dVar38 != 0.0) || (pdVar17 = pdVar20, pdVar18 = pdVar19, NAN(dVar38))) {
      dVar40 = -dVar23;
      dVar39 = dVar38 * dVar40;
      dVar26 = splitter * dVar40 - (dVar23 + splitter * dVar40);
      dVar34 = dVar38 * splitter - (dVar38 * splitter - dVar38);
      dVar35 = (dVar38 - dVar34) * (dVar40 - dVar26) -
               (((dVar39 - dVar26 * dVar34) - dVar34 * (dVar40 - dVar26)) -
               dVar26 * (dVar38 - dVar34));
      dVar34 = dVar28 * splitter - (dVar28 * splitter - dVar28);
      dVar29 = dVar28 - dVar34;
      dVar26 = dVar28 * dVar35;
      dVar40 = splitter * dVar35 - (splitter * dVar35 - dVar35);
      local_1178 = (dVar35 - dVar40) * dVar29 -
                   (((dVar26 - dVar40 * dVar34) - (dVar35 - dVar40) * dVar34) - dVar40 * dVar29);
      dVar28 = dVar28 * dVar39;
      dVar40 = splitter * dVar39 - (splitter * dVar39 - dVar39);
      dVar40 = (dVar39 - dVar40) * dVar29 -
               (((dVar28 - dVar40 * dVar34) - dVar34 * (dVar39 - dVar40)) - dVar40 * dVar29);
      local_1168 = dVar40 + dVar26;
      local_1170 = (dVar26 - (local_1168 - (local_1168 - dVar26))) +
                   (dVar40 - (local_1168 - dVar26));
      local_1160 = dVar28 + local_1168;
      local_1168 = local_1168 - (local_1160 - dVar28);
      iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar20,4,&local_1178,pdVar19);
      if ((dVar22 != 0.0) || (pdVar17 = pdVar19, pdVar18 = pdVar20, NAN(dVar22))) {
        dVar34 = dVar22 * splitter - (dVar22 * splitter - dVar22);
        dVar29 = dVar22 - dVar34;
        dVar40 = dVar22 * dVar35;
        dVar26 = dVar35 * splitter - (dVar35 * splitter - dVar35);
        local_1178 = (dVar35 - dVar26) * dVar29 -
                     (((dVar40 - dVar26 * dVar34) - (dVar35 - dVar26) * dVar34) - dVar26 * dVar29);
        dVar35 = dVar39 * dVar22;
        dVar26 = splitter * dVar39 - (splitter * dVar39 - dVar39);
        dVar26 = (dVar39 - dVar26) * dVar29 -
                 (((dVar35 - dVar26 * dVar34) - dVar34 * (dVar39 - dVar26)) - dVar26 * dVar29);
        local_1168 = dVar40 + dVar26;
        local_1170 = (dVar40 - (local_1168 - (local_1168 - dVar40))) +
                     (dVar26 - (local_1168 - dVar40));
        local_1160 = dVar35 + local_1168;
        local_1168 = local_1168 - (local_1160 - dVar35);
        iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar19,4,&local_1178,pdVar20);
        pdVar17 = pdVar20;
        pdVar18 = pdVar19;
      }
    }
  }
  pdVar19 = pdVar18;
  if ((dVar24 != 0.0) || (NAN(dVar24))) {
    if ((dVar38 != 0.0) || (pdVar20 = pdVar17, NAN(dVar38))) {
      dVar39 = dVar24 * dVar38;
      dVar40 = dVar24 * splitter - (dVar24 * splitter - dVar24);
      dVar26 = dVar38 * splitter - (dVar38 * splitter - dVar38);
      dVar23 = (dVar38 - dVar26) * (dVar24 - dVar40) -
               (((dVar39 - dVar40 * dVar26) - dVar26 * (dVar24 - dVar40)) -
               dVar40 * (dVar38 - dVar26));
      dVar29 = (double)local_10a8._0_8_ * splitter -
               ((double)local_10a8._0_8_ * splitter - (double)local_10a8._0_8_);
      dVar35 = (double)local_10a8._0_8_ - dVar29;
      dVar34 = (double)local_10a8._0_8_ * dVar23;
      dVar40 = splitter * dVar23 - (splitter * dVar23 - dVar23);
      local_1178 = (dVar23 - dVar40) * dVar35 -
                   (((dVar34 - dVar40 * dVar29) - (dVar23 - dVar40) * dVar29) - dVar40 * dVar35);
      dVar26 = (double)local_10a8._0_8_ * dVar39;
      dVar40 = splitter * dVar39 - (splitter * dVar39 - dVar39);
      dVar40 = (dVar39 - dVar40) * dVar35 -
               (((dVar26 - dVar40 * dVar29) - dVar29 * (dVar39 - dVar40)) - dVar40 * dVar35);
      local_1168 = dVar40 + dVar34;
      local_1170 = (dVar34 - (local_1168 - (local_1168 - dVar34))) +
                   (dVar40 - (local_1168 - dVar34));
      local_1160 = dVar26 + local_1168;
      local_1168 = local_1168 - (local_1160 - dVar26);
      iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar17,4,&local_1178,pdVar18);
      if ((dVar43 != 0.0) || (pdVar19 = pdVar17, pdVar20 = pdVar18, NAN(dVar43))) {
        dVar34 = dVar43 * splitter - (dVar43 * splitter - dVar43);
        dVar29 = dVar43 - dVar34;
        dVar40 = dVar43 * dVar23;
        dVar26 = dVar23 * splitter - (dVar23 * splitter - dVar23);
        local_1178 = (dVar23 - dVar26) * dVar29 -
                     (((dVar40 - dVar26 * dVar34) - (dVar23 - dVar26) * dVar34) - dVar26 * dVar29);
        dVar35 = dVar39 * dVar43;
        dVar26 = splitter * dVar39 - (splitter * dVar39 - dVar39);
        dVar26 = (dVar39 - dVar26) * dVar29 -
                 (((dVar35 - dVar26 * dVar34) - dVar34 * (dVar39 - dVar26)) - dVar26 * dVar29);
        local_1168 = dVar40 + dVar26;
        local_1170 = (dVar40 - (local_1168 - (local_1168 - dVar40))) +
                     (dVar26 - (local_1168 - dVar40));
        local_1160 = dVar35 + local_1168;
        local_1168 = local_1168 - (local_1160 - dVar35);
        iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar18,4,&local_1178,pdVar17);
        pdVar19 = pdVar18;
        pdVar20 = pdVar17;
      }
    }
    pdVar17 = pdVar20;
    if ((dVar47 == 0.0) && (!NAN(dVar47))) goto LAB_00160dc6;
    dVar40 = -dVar24;
    dVar35 = dVar47 * dVar40;
    dVar26 = splitter * dVar40 - (dVar24 + splitter * dVar40);
    dVar34 = dVar47 * splitter - (dVar47 * splitter - dVar47);
    dVar29 = (dVar47 - dVar34) * (dVar40 - dVar26) -
             (((dVar35 - dVar26 * dVar34) - dVar34 * (dVar40 - dVar26)) - dVar26 * (dVar47 - dVar34)
             );
    dVar47 = dVar32 * splitter - (dVar32 * splitter - dVar32);
    dVar34 = dVar32 - dVar47;
    dVar26 = dVar32 * dVar29;
    dVar40 = splitter * dVar29 - (splitter * dVar29 - dVar29);
    local_1178 = (dVar29 - dVar40) * dVar34 -
                 (((dVar26 - dVar40 * dVar47) - (dVar29 - dVar40) * dVar47) - dVar40 * dVar34);
    dVar32 = dVar32 * dVar35;
    dVar40 = splitter * dVar35 - (splitter * dVar35 - dVar35);
    dVar40 = (dVar35 - dVar40) * dVar34 -
             (((dVar32 - dVar40 * dVar47) - dVar47 * (dVar35 - dVar40)) - dVar40 * dVar34);
    local_1168 = dVar40 + dVar26;
    local_1170 = (dVar26 - (local_1168 - (local_1168 - dVar26))) + (dVar40 - (local_1168 - dVar26));
    local_1160 = dVar32 + local_1168;
    local_1168 = local_1168 - (local_1160 - dVar32);
    iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar20,4,&local_1178,pdVar19);
    if ((dVar42 == 0.0) && (pdVar18 = pdVar19, !NAN(dVar42))) goto LAB_00160e09;
    dVar47 = dVar42 * splitter - (dVar42 * splitter - dVar42);
    dVar34 = dVar42 - dVar47;
    dVar40 = dVar42 * dVar29;
    dVar26 = dVar29 * splitter - (dVar29 * splitter - dVar29);
    local_1178 = (dVar29 - dVar26) * dVar34 -
                 (((dVar40 - dVar26 * dVar47) - (dVar29 - dVar26) * dVar47) - dVar26 * dVar34);
    dVar29 = dVar35 * dVar42;
    dVar26 = splitter * dVar35 - (splitter * dVar35 - dVar35);
    dVar26 = (dVar35 - dVar26) * dVar34 -
             (((dVar29 - dVar26 * dVar47) - dVar47 * (dVar35 - dVar26)) - dVar26 * dVar34);
    local_1168 = dVar40 + dVar26;
    local_1170 = (dVar40 - (local_1168 - (local_1168 - dVar40))) + (dVar26 - (local_1168 - dVar40));
    local_1160 = dVar29 + local_1168;
    local_1168 = local_1168 - (local_1160 - dVar29);
    iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar19,4,&local_1178,pdVar20);
  }
  else {
LAB_00160dc6:
    if ((dVar42 == 0.0) && (pdVar18 = pdVar17, pdVar20 = pdVar19, !NAN(dVar42))) goto LAB_00160e09;
  }
  iVar14 = scale_expansion_zeroelim(iVar14,local_db8,dVar42,local_f18);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar17,iVar14,local_f18,pdVar19);
  pdVar18 = pdVar19;
  pdVar20 = pdVar17;
LAB_00160e09:
  if ((dVar43 != 0.0) || (pdVar17 = pdVar20, NAN(dVar43))) {
    iVar13 = scale_expansion_zeroelim(iVar13,local_df8,dVar43,local_f18);
    iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar18,iVar13,local_f18,pdVar20);
    pdVar17 = pdVar18;
    pdVar18 = pdVar20;
  }
  if ((dVar22 != 0.0) || (NAN(dVar22))) {
    iVar11 = scale_expansion_zeroelim(iVar11,local_e38,dVar22,local_f18);
    iVar12 = fast_expansion_sum_zeroelim(iVar12,pdVar18,iVar11,local_f18,pdVar17);
    pdVar18 = pdVar17;
  }
  return pdVar18[(long)iVar12 + -1];
}

Assistant:

REAL orient3dadapt(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL permanent)
{
  INEXACT REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL det, errbound;

  INEXACT REAL bdxcdy1, cdxbdy1, cdxady1, adxcdy1, adxbdy1, bdxady1;
  REAL bdxcdy0, cdxbdy0, cdxady0, adxcdy0, adxbdy0, bdxady0;
  REAL bc[4], ca[4], ab[4];
  INEXACT REAL bc3, ca3, ab3;
  REAL adet[8], bdet[8], cdet[8];
  int alen, blen, clen;
  REAL abdet[16];
  int ablen;
  REAL *finnow, *finother, *finswap;
  REAL fin1[192], fin2[192];
  int finlength;


  REAL adxtail, bdxtail, cdxtail;
  REAL adytail, bdytail, cdytail;
  REAL adztail, bdztail, cdztail;
  INEXACT REAL at_blarge, at_clarge;
  INEXACT REAL bt_clarge, bt_alarge;
  INEXACT REAL ct_alarge, ct_blarge;
  REAL at_b[4], at_c[4], bt_c[4], bt_a[4], ct_a[4], ct_b[4];
  int at_blen, at_clen, bt_clen, bt_alen, ct_alen, ct_blen;
  INEXACT REAL bdxt_cdy1, cdxt_bdy1, cdxt_ady1;
  INEXACT REAL adxt_cdy1, adxt_bdy1, bdxt_ady1;
  REAL bdxt_cdy0, cdxt_bdy0, cdxt_ady0;
  REAL adxt_cdy0, adxt_bdy0, bdxt_ady0;
  INEXACT REAL bdyt_cdx1, cdyt_bdx1, cdyt_adx1;
  INEXACT REAL adyt_cdx1, adyt_bdx1, bdyt_adx1;
  REAL bdyt_cdx0, cdyt_bdx0, cdyt_adx0;
  REAL adyt_cdx0, adyt_bdx0, bdyt_adx0;
  REAL bct[8], cat[8], abt[8];
  int bctlen, catlen, abtlen;
  INEXACT REAL bdxt_cdyt1, cdxt_bdyt1, cdxt_adyt1;
  INEXACT REAL adxt_cdyt1, adxt_bdyt1, bdxt_adyt1;
  REAL bdxt_cdyt0, cdxt_bdyt0, cdxt_adyt0;
  REAL adxt_cdyt0, adxt_bdyt0, bdxt_adyt0;
  REAL u[4], v[12], w[16];
  INEXACT REAL u3;
  int vlength, wlength;
  REAL negate;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k;
  REAL _0;


  adx = (REAL) (pa[0] - pd[0]);
  bdx = (REAL) (pb[0] - pd[0]);
  cdx = (REAL) (pc[0] - pd[0]);
  ady = (REAL) (pa[1] - pd[1]);
  bdy = (REAL) (pb[1] - pd[1]);
  cdy = (REAL) (pc[1] - pd[1]);
  adz = (REAL) (pa[2] - pd[2]);
  bdz = (REAL) (pb[2] - pd[2]);
  cdz = (REAL) (pc[2] - pd[2]);

  Two_Product(bdx, cdy, bdxcdy1, bdxcdy0);
  Two_Product(cdx, bdy, cdxbdy1, cdxbdy0);
  Two_Two_Diff(bdxcdy1, bdxcdy0, cdxbdy1, cdxbdy0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;
  alen = scale_expansion_zeroelim(4, bc, adz, adet);

  Two_Product(cdx, ady, cdxady1, cdxady0);
  Two_Product(adx, cdy, adxcdy1, adxcdy0);
  Two_Two_Diff(cdxady1, cdxady0, adxcdy1, adxcdy0, ca3, ca[2], ca[1], ca[0]);
  ca[3] = ca3;
  blen = scale_expansion_zeroelim(4, ca, bdz, bdet);

  Two_Product(adx, bdy, adxbdy1, adxbdy0);
  Two_Product(bdx, ady, bdxady1, bdxady0);
  Two_Two_Diff(adxbdy1, adxbdy0, bdxady1, bdxady0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;
  clen = scale_expansion_zeroelim(4, ab, cdz, cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, fin1);

  det = estimate(finlength, fin1);
  errbound = o3derrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pd[0], adx, adxtail);
  Two_Diff_Tail(pb[0], pd[0], bdx, bdxtail);
  Two_Diff_Tail(pc[0], pd[0], cdx, cdxtail);
  Two_Diff_Tail(pa[1], pd[1], ady, adytail);
  Two_Diff_Tail(pb[1], pd[1], bdy, bdytail);
  Two_Diff_Tail(pc[1], pd[1], cdy, cdytail);
  Two_Diff_Tail(pa[2], pd[2], adz, adztail);
  Two_Diff_Tail(pb[2], pd[2], bdz, bdztail);
  Two_Diff_Tail(pc[2], pd[2], cdz, cdztail);

  if ((adxtail == 0.0) && (bdxtail == 0.0) && (cdxtail == 0.0)
      && (adytail == 0.0) && (bdytail == 0.0) && (cdytail == 0.0)
      && (adztail == 0.0) && (bdztail == 0.0) && (cdztail == 0.0)) {
    return det;
  }

  errbound = o3derrboundC * permanent + resulterrbound * Absolute(det);
  det += (adz * ((bdx * cdytail + cdy * bdxtail)
                 - (bdy * cdxtail + cdx * bdytail))
          + adztail * (bdx * cdy - bdy * cdx))
       + (bdz * ((cdx * adytail + ady * cdxtail)
                 - (cdy * adxtail + adx * cdytail))
          + bdztail * (cdx * ady - cdy * adx))
       + (cdz * ((adx * bdytail + bdy * adxtail)
                 - (ady * bdxtail + bdx * adytail))
          + cdztail * (adx * bdy - ady * bdx));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  finnow = fin1;
  finother = fin2;

  if (adxtail == 0.0) {
    if (adytail == 0.0) {
      at_b[0] = 0.0;
      at_blen = 1;
      at_c[0] = 0.0;
      at_clen = 1;
    } else {
      negate = -adytail;
      Two_Product(negate, bdx, at_blarge, at_b[0]);
      at_b[1] = at_blarge;
      at_blen = 2;
      Two_Product(adytail, cdx, at_clarge, at_c[0]);
      at_c[1] = at_clarge;
      at_clen = 2;
    }
  } else {
    if (adytail == 0.0) {
      Two_Product(adxtail, bdy, at_blarge, at_b[0]);
      at_b[1] = at_blarge;
      at_blen = 2;
      negate = -adxtail;
      Two_Product(negate, cdy, at_clarge, at_c[0]);
      at_c[1] = at_clarge;
      at_clen = 2;
    } else {
      Two_Product(adxtail, bdy, adxt_bdy1, adxt_bdy0);
      Two_Product(adytail, bdx, adyt_bdx1, adyt_bdx0);
      Two_Two_Diff(adxt_bdy1, adxt_bdy0, adyt_bdx1, adyt_bdx0,
                   at_blarge, at_b[2], at_b[1], at_b[0]);
      at_b[3] = at_blarge;
      at_blen = 4;
      Two_Product(adytail, cdx, adyt_cdx1, adyt_cdx0);
      Two_Product(adxtail, cdy, adxt_cdy1, adxt_cdy0);
      Two_Two_Diff(adyt_cdx1, adyt_cdx0, adxt_cdy1, adxt_cdy0,
                   at_clarge, at_c[2], at_c[1], at_c[0]);
      at_c[3] = at_clarge;
      at_clen = 4;
    }
  }
  if (bdxtail == 0.0) {
    if (bdytail == 0.0) {
      bt_c[0] = 0.0;
      bt_clen = 1;
      bt_a[0] = 0.0;
      bt_alen = 1;
    } else {
      negate = -bdytail;
      Two_Product(negate, cdx, bt_clarge, bt_c[0]);
      bt_c[1] = bt_clarge;
      bt_clen = 2;
      Two_Product(bdytail, adx, bt_alarge, bt_a[0]);
      bt_a[1] = bt_alarge;
      bt_alen = 2;
    }
  } else {
    if (bdytail == 0.0) {
      Two_Product(bdxtail, cdy, bt_clarge, bt_c[0]);
      bt_c[1] = bt_clarge;
      bt_clen = 2;
      negate = -bdxtail;
      Two_Product(negate, ady, bt_alarge, bt_a[0]);
      bt_a[1] = bt_alarge;
      bt_alen = 2;
    } else {
      Two_Product(bdxtail, cdy, bdxt_cdy1, bdxt_cdy0);
      Two_Product(bdytail, cdx, bdyt_cdx1, bdyt_cdx0);
      Two_Two_Diff(bdxt_cdy1, bdxt_cdy0, bdyt_cdx1, bdyt_cdx0,
                   bt_clarge, bt_c[2], bt_c[1], bt_c[0]);
      bt_c[3] = bt_clarge;
      bt_clen = 4;
      Two_Product(bdytail, adx, bdyt_adx1, bdyt_adx0);
      Two_Product(bdxtail, ady, bdxt_ady1, bdxt_ady0);
      Two_Two_Diff(bdyt_adx1, bdyt_adx0, bdxt_ady1, bdxt_ady0,
                  bt_alarge, bt_a[2], bt_a[1], bt_a[0]);
      bt_a[3] = bt_alarge;
      bt_alen = 4;
    }
  }
  if (cdxtail == 0.0) {
    if (cdytail == 0.0) {
      ct_a[0] = 0.0;
      ct_alen = 1;
      ct_b[0] = 0.0;
      ct_blen = 1;
    } else {
      negate = -cdytail;
      Two_Product(negate, adx, ct_alarge, ct_a[0]);
      ct_a[1] = ct_alarge;
      ct_alen = 2;
      Two_Product(cdytail, bdx, ct_blarge, ct_b[0]);
      ct_b[1] = ct_blarge;
      ct_blen = 2;
    }
  } else {
    if (cdytail == 0.0) {
      Two_Product(cdxtail, ady, ct_alarge, ct_a[0]);
      ct_a[1] = ct_alarge;
      ct_alen = 2;
      negate = -cdxtail;
      Two_Product(negate, bdy, ct_blarge, ct_b[0]);
      ct_b[1] = ct_blarge;
      ct_blen = 2;
    } else {
      Two_Product(cdxtail, ady, cdxt_ady1, cdxt_ady0);
      Two_Product(cdytail, adx, cdyt_adx1, cdyt_adx0);
      Two_Two_Diff(cdxt_ady1, cdxt_ady0, cdyt_adx1, cdyt_adx0,
                   ct_alarge, ct_a[2], ct_a[1], ct_a[0]);
      ct_a[3] = ct_alarge;
      ct_alen = 4;
      Two_Product(cdytail, bdx, cdyt_bdx1, cdyt_bdx0);
      Two_Product(cdxtail, bdy, cdxt_bdy1, cdxt_bdy0);
      Two_Two_Diff(cdyt_bdx1, cdyt_bdx0, cdxt_bdy1, cdxt_bdy0,
                   ct_blarge, ct_b[2], ct_b[1], ct_b[0]);
      ct_b[3] = ct_blarge;
      ct_blen = 4;
    }
  }

  bctlen = fast_expansion_sum_zeroelim(bt_clen, bt_c, ct_blen, ct_b, bct);
  wlength = scale_expansion_zeroelim(bctlen, bct, adz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  catlen = fast_expansion_sum_zeroelim(ct_alen, ct_a, at_clen, at_c, cat);
  wlength = scale_expansion_zeroelim(catlen, cat, bdz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  abtlen = fast_expansion_sum_zeroelim(at_blen, at_b, bt_alen, bt_a, abt);
  wlength = scale_expansion_zeroelim(abtlen, abt, cdz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  if (adztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, bc, adztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (bdztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, ca, bdztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (cdztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, ab, cdztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }

  if (adxtail != 0.0) {
    if (bdytail != 0.0) {
      Two_Product(adxtail, bdytail, adxt_bdyt1, adxt_bdyt0);
      Two_One_Product(adxt_bdyt1, adxt_bdyt0, cdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (cdztail != 0.0) {
        Two_One_Product(adxt_bdyt1, adxt_bdyt0, cdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (cdytail != 0.0) {
      negate = -adxtail;
      Two_Product(negate, cdytail, adxt_cdyt1, adxt_cdyt0);
      Two_One_Product(adxt_cdyt1, adxt_cdyt0, bdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (bdztail != 0.0) {
        Two_One_Product(adxt_cdyt1, adxt_cdyt0, bdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }
  if (bdxtail != 0.0) {
    if (cdytail != 0.0) {
      Two_Product(bdxtail, cdytail, bdxt_cdyt1, bdxt_cdyt0);
      Two_One_Product(bdxt_cdyt1, bdxt_cdyt0, adz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (adztail != 0.0) {
        Two_One_Product(bdxt_cdyt1, bdxt_cdyt0, adztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (adytail != 0.0) {
      negate = -bdxtail;
      Two_Product(negate, adytail, bdxt_adyt1, bdxt_adyt0);
      Two_One_Product(bdxt_adyt1, bdxt_adyt0, cdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (cdztail != 0.0) {
        Two_One_Product(bdxt_adyt1, bdxt_adyt0, cdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }
  if (cdxtail != 0.0) {
    if (adytail != 0.0) {
      Two_Product(cdxtail, adytail, cdxt_adyt1, cdxt_adyt0);
      Two_One_Product(cdxt_adyt1, cdxt_adyt0, bdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (bdztail != 0.0) {
        Two_One_Product(cdxt_adyt1, cdxt_adyt0, bdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (bdytail != 0.0) {
      negate = -cdxtail;
      Two_Product(negate, bdytail, cdxt_bdyt1, cdxt_bdyt0);
      Two_One_Product(cdxt_bdyt1, cdxt_bdyt0, adz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (adztail != 0.0) {
        Two_One_Product(cdxt_bdyt1, cdxt_bdyt0, adztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }

  if (adztail != 0.0) {
    wlength = scale_expansion_zeroelim(bctlen, bct, adztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (bdztail != 0.0) {
    wlength = scale_expansion_zeroelim(catlen, cat, bdztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (cdztail != 0.0) {
    wlength = scale_expansion_zeroelim(abtlen, abt, cdztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }

  return finnow[finlength - 1];
}